

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O0

int ptls_minicrypto_lookup_certificate_add_identity
              (ptls_minicrypto_lookup_certificate_t *self,char *server_name,
              uint16_t signature_algorithm,ptls_iovec_t key,ptls_iovec_t *certs,size_t num_certs)

{
  long lVar1;
  st_ptls_minicrypto_identity_t **__dest;
  st_ptls_minicrypto_identity_t *psVar2;
  undefined1 local_98 [76];
  int local_4c;
  void *pvStack_48;
  int ret;
  st_ptls_minicrypto_identity_t **list;
  st_ptls_minicrypto_identity_t *identity;
  ptls_iovec_t *certs_local;
  char *pcStack_28;
  uint16_t signature_algorithm_local;
  char *server_name_local;
  ptls_minicrypto_lookup_certificate_t *self_local;
  ptls_iovec_t key_local;
  
  key_local.base = (uint8_t *)key.len;
  self_local = (ptls_minicrypto_lookup_certificate_t *)key.base;
  list = (st_ptls_minicrypto_identity_t **)0x0;
  identity = (st_ptls_minicrypto_identity_t *)certs;
  certs_local._6_2_ = signature_algorithm;
  pcStack_28 = server_name;
  server_name_local = (char *)self;
  if ((signature_algorithm == 0x403) && (key_local.base == (uint8_t *)0x20)) {
    __dest = (st_ptls_minicrypto_identity_t **)malloc(num_certs * 0x10 + 0x38);
    list = __dest;
    if (__dest == (st_ptls_minicrypto_identity_t **)0x0) {
      local_4c = 0x201;
    }
    else {
      memset(local_98,0,0x48);
      memcpy(__dest,local_98,0x48);
      psVar2 = (st_ptls_minicrypto_identity_t *)strdup(pcStack_28);
      *list = psVar2;
      if (psVar2 == (st_ptls_minicrypto_identity_t *)0x0) {
        local_4c = 0x201;
      }
      else {
        psVar2 = (st_ptls_minicrypto_identity_t *)strlen(pcStack_28);
        list[1] = psVar2;
        memcpy(list + 2,self_local,(size_t)key_local.base);
        while (list[6] != (st_ptls_minicrypto_identity_t *)num_certs) {
          psVar2 = (st_ptls_minicrypto_identity_t *)
                   malloc(*(size_t *)(identity->key + (long)list[6] * 0x10 + -8));
          list[(long)list[6] * 2 + 7] = psVar2;
          if (psVar2 == (st_ptls_minicrypto_identity_t *)0x0) {
            local_4c = 0x201;
            goto LAB_0011ba8b;
          }
          memcpy(list[(long)list[6] * 2 + 7],
                 *(void **)(identity->key + (long)list[6] * 0x10 + -0x10),
                 *(size_t *)(identity->key + (long)list[6] * 0x10 + -8));
          list[(long)list[6] * 2 + 8] =
               *(st_ptls_minicrypto_identity_t **)(identity->key + (long)list[6] * 0x10 + -8);
          list[6] = (st_ptls_minicrypto_identity_t *)((long)&(list[6]->name).base + 1);
        }
        pvStack_48 = realloc(*(void **)(server_name_local + 8),
                             (*(long *)(server_name_local + 0x10) + 1) * 8);
        if (pvStack_48 == (void *)0x0) {
          local_4c = 0x201;
        }
        else {
          *(void **)(server_name_local + 8) = pvStack_48;
          lVar1 = *(long *)(server_name_local + 0x10);
          *(long *)(server_name_local + 0x10) = lVar1 + 1;
          *(st_ptls_minicrypto_identity_t ***)(*(long *)(server_name_local + 8) + lVar1 * 8) = list;
          local_4c = 0;
        }
      }
    }
  }
  else {
    local_4c = 0x204;
  }
LAB_0011ba8b:
  if ((local_4c != 0) && (list != (st_ptls_minicrypto_identity_t **)0x0)) {
    free_identity((st_ptls_minicrypto_identity_t *)list);
  }
  return local_4c;
}

Assistant:

int ptls_minicrypto_lookup_certificate_add_identity(ptls_minicrypto_lookup_certificate_t *self, const char *server_name,
                                                    uint16_t signature_algorithm, ptls_iovec_t key, ptls_iovec_t *certs,
                                                    size_t num_certs)
{
    struct st_ptls_minicrypto_identity_t *identity = NULL, **list;
    int ret;

    /* check args */
    if (!(signature_algorithm == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256 && key.len == sizeof(identity->key))) {
        ret = PTLS_ERROR_INCOMPATIBLE_KEY;
        goto Exit;
    }

    /* create new identity object */
    if ((identity = (struct st_ptls_minicrypto_identity_t *)malloc(offsetof(struct st_ptls_minicrypto_identity_t, certs) +
                                                                   sizeof(identity->certs[0]) * num_certs)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *identity = (struct st_ptls_minicrypto_identity_t){{NULL}};
    if ((identity->name.base = (uint8_t *)strdup(server_name)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    identity->name.len = strlen(server_name);
    memcpy(identity->key, key.base, key.len);
    for (; identity->num_certs != num_certs; ++identity->num_certs) {
        if ((identity->certs[identity->num_certs].base = (uint8_t *)malloc(certs[identity->num_certs].len)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        memcpy(identity->certs[identity->num_certs].base, certs[identity->num_certs].base, certs[identity->num_certs].len);
        identity->certs[identity->num_certs].len = certs[identity->num_certs].len;
    }

    /* add to the list */
    if ((list = realloc(self->identities, sizeof(self->identities[0]) * (self->count + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    self->identities = list;
    self->identities[self->count++] = identity;

    ret = 0;
Exit:
    if (ret != 0 && identity != NULL)
        free_identity(identity);
    return ret;
}